

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_directory.cc
# Opt level: O0

int __thiscall CrailDirectory::Enumerate(CrailDirectory *this)

{
  int iVar1;
  int iVar2;
  unsigned_long_long uVar3;
  element_type *peVar4;
  char *pcVar5;
  DirectoryRecord *in_RDI;
  int i;
  DirectoryRecord record;
  shared_ptr<crail::ByteBuffer> buf;
  unique_ptr<CrailInputstream,_std::default_delete<CrailInputstream>_> input_stream;
  int records;
  shared_ptr<crail::ByteBuffer> *in_stack_00000230;
  CrailInputstream *in_stack_00000238;
  shared_ptr<crail::ByteBuffer> *in_stack_ffffffffffffff28;
  Future<int> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int *this_00;
  undefined1 local_a0 [60];
  int local_64;
  DirectoryRecord local_60;
  undefined4 local_34;
  int *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  shared_ptr<BlockCache> *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  DirectoryRecord *__args;
  
  this_00 = &in_RDI->valid_;
  __args = in_RDI;
  uVar3 = FileInfo::capacity((FileInfo *)this_00);
  iVar1 = (int)(uVar3 >> 9);
  std::
  make_unique<CrailInputstream,std::shared_ptr<NamenodeClient>&,std::shared_ptr<StorageCache>&,std::shared_ptr<BlockCache>&,FileInfo&,int>
            ((shared_ptr<NamenodeClient> *)__args,
             (shared_ptr<StorageCache> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,(FileInfo *)(ulong)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  local_34 = 0x200;
  std::make_shared<crail::ByteBuffer,int>(this_00);
  DirectoryRecord::DirectoryRecord(in_RDI);
  for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
    peVar4 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15eed5);
    crail::ByteBuffer::Clear(peVar4);
    std::unique_ptr<CrailInputstream,_std::default_delete<CrailInputstream>_>::operator->
              ((unique_ptr<CrailInputstream,_std::default_delete<CrailInputstream>_> *)0x15eeec);
    std::shared_ptr<crail::ByteBuffer>::shared_ptr
              ((shared_ptr<crail::ByteBuffer> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
    ;
    CrailInputstream::Read(in_stack_00000238,in_stack_00000230);
    Future<int>::get(in_stack_ffffffffffffff30);
    Future<int>::~Future((Future<int> *)0x15ef34);
    std::shared_ptr<crail::ByteBuffer>::~shared_ptr((shared_ptr<crail::ByteBuffer> *)0x15ef3e);
    peVar4 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15ef4b);
    crail::ByteBuffer::Flip(peVar4);
    peVar4 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffff30);
    DirectoryRecord::Update(&local_60,peVar4);
    iVar2 = DirectoryRecord::valid(&local_60);
    if (iVar2 != 0) {
      DirectoryRecord::name((DirectoryRecord *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
      pcVar5 = (char *)std::string::c_str();
      in_stack_ffffffffffffff30 = (Future<int> *)std::operator<<((ostream *)&std::cout,pcVar5);
      std::ostream::operator<<(in_stack_ffffffffffffff30,std::endl<char,std::char_traits<char>>);
      std::string::~string(local_a0);
    }
  }
  DirectoryRecord::~DirectoryRecord((DirectoryRecord *)0x15f0a8);
  std::shared_ptr<crail::ByteBuffer>::~shared_ptr((shared_ptr<crail::ByteBuffer> *)0x15f0b5);
  std::unique_ptr<CrailInputstream,_std::default_delete<CrailInputstream>_>::~unique_ptr
            ((unique_ptr<CrailInputstream,_std::default_delete<CrailInputstream>_> *)
             in_stack_ffffffffffffff30);
  return 0;
}

Assistant:

int CrailDirectory::Enumerate() {
  int records = file_info_.capacity() / 512;
  unique_ptr<CrailInputstream> input_stream = make_unique<CrailInputstream>(
      namenode_client_, storage_cache_, block_cache_, file_info_, 0);
  shared_ptr<ByteBuffer> buf = make_shared<ByteBuffer>(512);
  DirectoryRecord record;
  for (int i = 0; i < records; i++) {
    buf->Clear();
    input_stream->Read(buf).get();
    buf->Flip();
    record.Update(*buf);
    if (record.valid()) {
      cout << record.name().c_str() << endl;
    }
  }

  return 0;
}